

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O1

KDataStream * __thiscall
KDIS::DATA_TYPE::OrientationError::Encode
          (KDataStream *__return_storage_ptr__,OrientationError *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  (*(this->m_AziErr).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AziErr,__return_storage_ptr__);
  (*(this->m_ElvErr).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ElvErr,__return_storage_ptr__);
  (*(this->m_RotErr).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_RotErr,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream OrientationError::Encode() const
{
    KDataStream stream;

    OrientationError::Encode( stream );

    return stream;
}